

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::rowsInserted(QFileDialogPrivate *this,QModelIndex *parent)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  Ui_QFileDialog *pUVar4;
  QItemSelectionModel *pQVar5;
  QAbstractItemModel *pQVar6;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar4 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                     ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                      &in_RDI[0x24].m);
  if (pUVar4->treeView != (QFileDialogTreeView *)0x0) {
    this_00 = in_RSI;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
               &in_RDI[0x24].m);
    QAbstractItemView::rootIndex((QAbstractItemView *)in_RDI);
    bVar2 = ::operator!=(in_RDI,in_RSI);
    if (!bVar2) {
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                 &in_RDI[0x24].m);
      pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
      if (pQVar5 != (QItemSelectionModel *)0x0) {
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                   &in_RDI[0x24].m);
        QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
        bVar3 = QItemSelectionModel::hasSelection();
        if ((bVar3 & 1) == 0) {
          QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                    ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                     &in_RDI[0x24].m);
          pQVar6 = QAbstractItemView::model((QAbstractItemView *)this_00);
          (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,this_00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::rowsInserted(const QModelIndex &parent)
{
    if (!qFileDialogUi->treeView
        || parent != qFileDialogUi->treeView->rootIndex()
        || !qFileDialogUi->treeView->selectionModel()
        || qFileDialogUi->treeView->selectionModel()->hasSelection()
        || qFileDialogUi->treeView->model()->rowCount(parent) == 0)
        return;
}